

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::api::json::DecodePsbtInput::ConvertFromStruct
          (DecodePsbtInput *this,DecodePsbtInputStruct *data)

{
  DecodePsbtUtxo *in_RSI;
  DecodePsbtUtxoStruct *in_RDI;
  vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *in_stack_00000098;
  JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *in_stack_000000a0;
  vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *in_stack_000000d8;
  JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct> *in_stack_000000e0;
  
  std::__cxx11::string::operator=
            ((string *)(in_RDI->script_pub_key).hex.field_2._M_local_buf,(string *)in_RSI);
  DecodeRawTransactionResponse::ConvertFromStruct
            ((DecodeRawTransactionResponse *)in_RSI,(DecodeRawTransactionResponseStruct *)in_RDI);
  DecodePsbtUtxo::ConvertFromStruct(in_RSI,in_RDI);
  core::JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct>::
  ConvertFromStruct((JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct> *)
                    in_stack_000000a0,
                    (vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> *)
                    in_stack_00000098);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[2].script_pub_key.address._M_string_length,
             (string *)&in_RSI[1].script_pub_key_.address_._M_string_length);
  PsbtScriptData::ConvertFromStruct((PsbtScriptData *)in_RSI,(PsbtScriptDataStruct *)in_RDI);
  PsbtScriptData::ConvertFromStruct((PsbtScriptData *)in_RSI,(PsbtScriptDataStruct *)in_RDI);
  core::JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct>::ConvertFromStruct
            (in_stack_000000e0,in_stack_000000d8);
  DecodeUnlockingScript::ConvertFromStruct
            ((DecodeUnlockingScript *)in_RSI,(DecodeUnlockingScriptStruct *)in_RDI);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct((JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)data);
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertFromStruct
            (in_stack_000000a0,in_stack_00000098);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RSI,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RDI);
  return;
}

Assistant:

void DecodePsbtInput::ConvertFromStruct(
    const DecodePsbtInputStruct& data) {
  non_witness_utxo_hex_ = data.non_witness_utxo_hex;
  non_witness_utxo_.ConvertFromStruct(data.non_witness_utxo);
  witness_utxo_.ConvertFromStruct(data.witness_utxo);
  partial_signatures_.ConvertFromStruct(data.partial_signatures);
  sighash_ = data.sighash;
  redeem_script_.ConvertFromStruct(data.redeem_script);
  witness_script_.ConvertFromStruct(data.witness_script);
  bip32_derivs_.ConvertFromStruct(data.bip32_derivs);
  final_scriptsig_.ConvertFromStruct(data.final_scriptsig);
  final_scriptwitness_.ConvertFromStruct(data.final_scriptwitness);
  unknown_.ConvertFromStruct(data.unknown);
  ignore_items = data.ignore_items;
}